

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_result drwav_fopen(FILE **ppFile,char *pFilePath,char *pOpenMode)

{
  FILE *pFVar1;
  int *piVar2;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  drwav_result result;
  undefined4 local_24;
  undefined4 local_4;
  
  if (in_RDI != (long *)0x0) {
    *in_RDI = 0;
  }
  if (((in_RSI == (char *)0x0) || (in_RDX == (char *)0x0)) || (in_RDI == (long *)0x0)) {
    local_4 = -2;
  }
  else {
    pFVar1 = fopen(in_RSI,in_RDX);
    *in_RDI = (long)pFVar1;
    if (*in_RDI == 0) {
      piVar2 = __errno_location();
      local_24 = drwav_result_from_errno(*piVar2);
      if (local_24 == 0) {
        local_24 = -1;
      }
      local_4 = local_24;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static drwav_result drwav_fopen(FILE** ppFile, const char* pFilePath, const char* pOpenMode)
{
#if _MSC_VER && _MSC_VER >= 1400
    errno_t err;
#endif

    if (ppFile != NULL) {
        *ppFile = NULL;  /* Safety. */
    }

    if (pFilePath == NULL || pOpenMode == NULL || ppFile == NULL) {
        return DRWAV_INVALID_ARGS;
    }

#if _MSC_VER && _MSC_VER >= 1400
    err = fopen_s(ppFile, pFilePath, pOpenMode);
    if (err != 0) {
        return drwav_result_from_errno(err);
    }
#else
#if defined(_WIN32) || defined(__APPLE__)
    *ppFile = fopen(pFilePath, pOpenMode);
#else
    #if defined(_FILE_OFFSET_BITS) && _FILE_OFFSET_BITS == 64 && defined(_LARGEFILE64_SOURCE)
        *ppFile = fopen64(pFilePath, pOpenMode);
    #else
        *ppFile = fopen(pFilePath, pOpenMode);
    #endif
#endif
    if (*ppFile == NULL) {
        drwav_result result = drwav_result_from_errno(errno);
        if (result == DRWAV_SUCCESS) {
            result = DRWAV_ERROR;   /* Just a safety check to make sure we never ever return success when pFile == NULL. */
        }

        return result;
    }
#endif

    return DRWAV_SUCCESS;
}